

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O3

void __thiscall
HoldingProperty_GetOperator_Test::~HoldingProperty_GetOperator_Test
          (HoldingProperty_GetOperator_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HoldingProperty, GetOperator)
{
  BasicHoldingProperties obj;
  
  EXPECT_EQ( 0, obj.int_value() );
  EXPECT_EQ( 0, obj.ro_int_value() );
  EXPECT_EQ( "", obj.string_value() );
  EXPECT_EQ( "", obj.ro_string_value() );

  obj.setIntValue( 86 );
  obj.setStringValue( "bob" );
  obj.setROIntValue( 53 );
  obj.setROStringValue( "bill" );
  
  EXPECT_EQ( 86, obj.int_value() );
  EXPECT_EQ( 53, obj.ro_int_value() );
  EXPECT_EQ( "bob", obj.string_value() );
  EXPECT_EQ( "bill", obj.ro_string_value() );
}